

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

pair<QHttpNetworkRequest,_QHttpNetworkReply_*> * __thiscall
QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::takeAt
          (pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *__return_storage_ptr__,
          QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *this,qsizetype i)

{
  pointer ppVar1;
  
  __return_storage_ptr__->second = (QHttpNetworkReply *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->first).super_QHttpNetworkHeader._vptr_QHttpNetworkHeader =
       (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->first).d.d.ptr = (QHttpNetworkRequestPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  ppVar1 = data(this);
  std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>::pair(__return_storage_ptr__,ppVar1 + i);
  remove(this,(char *)i);
  return __return_storage_ptr__;
}

Assistant:

T takeAt(qsizetype i) { T t = std::move((*this)[i]); remove(i); return t; }